

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall vm::VM::buildStringLiteralPool(VM *this)

{
  bool bVar1;
  int iVar2;
  addr_t addr_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  mapped_type *pmVar4;
  byte *pbVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_88;
  char ch;
  iterator __end3;
  iterator __begin3;
  str_t *__range3;
  slot_t *dst;
  string local_50 [4];
  addr_t addr;
  str_t str;
  Constant *c;
  iterator ed;
  iterator it;
  u2 i;
  VM *this_local;
  
  it._M_current._6_2_ = 0;
  ed = std::vector<vm::Constant,_std::allocator<vm::Constant>_>::begin(&(this->_file).constants);
  c = (Constant *)
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::end(&(this->_file).constants);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&ed,(__normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>
                            *)&c);
    if (!bVar1) break;
    str.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>
         ::operator*(&ed);
    if (((reference)str.field_2._8_8_)->type == STRING) {
      pbVar3 = std::get<std::__cxx11::string,std::__cxx11::string,int,double>
                         (&((reference)str.field_2._8_8_)->value);
      std::__cxx11::string::string(local_50,(string *)pbVar3);
      iVar2 = std::__cxx11::string::length();
      addr_00 = NEW(this,iVar2 + 1);
      pmVar4 = std::
               unordered_map<unsigned_short,_int,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_int>_>_>
               ::operator[](&this->_stringLiteralPool,(key_type *)((long)&it._M_current + 6));
      *pmVar4 = addr_00;
      __range3 = (str_t *)toHeapPtr(this,addr_00);
      __end3._M_current = (char *)std::__cxx11::string::begin();
      _Stack_88._M_current = (char *)std::__cxx11::string::end();
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff78);
        if (!bVar1) break;
        pbVar5 = (byte *)__gnu_cxx::
                         __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&__end3);
        *(uint *)__range3 = (uint)*pbVar5;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end3);
        __range3 = (str_t *)&__range3->field_0x4;
      }
      *(undefined4 *)__range3 = 0;
      std::__cxx11::string::~string(local_50);
    }
    it._M_current._6_2_ = it._M_current._6_2_ + 1;
    __gnu_cxx::
    __normal_iterator<vm::Constant_*,_std::vector<vm::Constant,_std::allocator<vm::Constant>_>_>::
    operator++(&ed);
  }
  return;
}

Assistant:

void VM::buildStringLiteralPool() {
    u2 i = 0;
    for (auto it = _file.constants.begin(), ed = _file.constants.end(); it != ed; ++it) {
        auto& c = *it;
        if (c.type == vm::Constant::Type::STRING) {
            str_t str = std::get<str_t>(c.value);
            addr_t addr = NEW(str.length()+1);
            _stringLiteralPool[i] = addr;
            slot_t* dst =  toHeapPtr(addr);
            for (auto ch : str) {
                *dst++ = ch & 0xff;
            }
            *dst = '\0';
        }
        ++i;
    }
}